

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseExportModuleField(WastParser *this,Module *module)

{
  Result RVar1;
  Enum EVar2;
  ExportModuleField *local_50;
  _Head_base<0UL,_wabt::ExportModuleField_*,_false> local_48;
  Location local_40;
  
  RVar1 = Expect(this,Lpar);
  if (RVar1.enum_ == Error) {
    EVar2 = Error;
  }
  else {
    GetLocation(&local_40,this);
    MakeUnique<wabt::ExportModuleField,wabt::Location>((wabt *)&local_50,&local_40);
    RVar1 = Expect(this,Export);
    EVar2 = Error;
    if (RVar1.enum_ != Error) {
      RVar1 = ParseQuotedText(this,&(local_50->export_).name);
      if (RVar1.enum_ != Error) {
        RVar1 = ParseExportDesc(this,&local_50->export_);
        if (RVar1.enum_ != Error) {
          RVar1 = Expect(this,Rpar);
          if (RVar1.enum_ != Error) {
            local_48._M_head_impl = local_50;
            local_50 = (ExportModuleField *)0x0;
            Module::AppendField(module,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                                        *)&local_48);
            if (local_48._M_head_impl != (ExportModuleField *)0x0) {
              (*((local_48._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).
                super_ModuleField._vptr_ModuleField[1])();
            }
            local_48._M_head_impl = (ExportModuleField *)0x0;
            EVar2 = Ok;
          }
        }
      }
    }
    if (local_50 != (ExportModuleField *)0x0) {
      (*(local_50->super_ModuleFieldMixin<(wabt::ModuleFieldType)3>).super_ModuleField.
        _vptr_ModuleField[1])();
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseExportModuleField(Module* module) {
  WABT_TRACE(ParseExportModuleField);
  EXPECT(Lpar);
  auto field = MakeUnique<ExportModuleField>(GetLocation());
  EXPECT(Export);
  CHECK_RESULT(ParseQuotedText(&field->export_.name));
  CHECK_RESULT(ParseExportDesc(&field->export_));
  EXPECT(Rpar);
  module->AppendField(std::move(field));
  return Result::Ok;
}